

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::BooleanDatatypeValidator::getCanonicalRepresentation
          (BooleanDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  bool bVar1;
  XMLCh *pXVar2;
  undefined7 in_register_00000009;
  undefined1 *toRep;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_DatatypeValidator).fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xc])
              (this,rawData,0,0,memMgr);
  }
  bVar1 = XMLString::equals(rawData,(XMLCh *)XMLUni::fgBooleanValueSpace);
  if (!bVar1) {
    bVar1 = XMLString::equals(rawData,(XMLCh *)(XMLUni::fgBooleanValueSpace + 0x20));
    if (!bVar1) {
      toRep = XMLUni::fgBooleanValueSpace + 0x10;
      goto LAB_002eb7c6;
    }
  }
  toRep = XMLUni::fgBooleanValueSpace;
LAB_002eb7c6:
  pXVar2 = XMLString::replicate((XMLCh *)toRep,memMgr);
  return pXVar2;
}

Assistant:

const XMLCh* BooleanDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                ,       MemoryManager* const memMgr
                                                                ,       bool           toValidate) const
{

    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    
    if (toValidate)
    {
        BooleanDatatypeValidator *temp = (BooleanDatatypeValidator*) this;

        try
        {
            temp->checkContent(rawData, 0, false, toUse);   
        }
        catch (...)
        {
            return 0;
        }
    }

    return ( XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[0]) ||
             XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[2])  ) ?
             XMLString::replicate(XMLUni::fgBooleanValueSpace[0], toUse) :
             XMLString::replicate(XMLUni::fgBooleanValueSpace[1], toUse) ;

}